

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_filter.hpp
# Opt level: O0

string * __thiscall Filter::VSParams_abi_cxx11_(string *__return_storage_ptr__,Filter *this)

{
  bool bVar1;
  ostream *poVar2;
  string local_208 [8];
  string type_name;
  Param *p;
  iterator __end1;
  iterator __begin1;
  vector<Param,_std::allocator<Param>_> *__range1;
  undefined1 local_1b8 [8];
  vector<Param,_std::allocator<Param>_> params;
  stringstream ss;
  ostream local_190 [376];
  Filter *local_18;
  Filter *this_local;
  
  local_18 = this;
  this_local = (Filter *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)
             &params.super__Vector_base<Param,_std::allocator<Param>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  (*this->_vptr_Filter[4])(local_1b8);
  __end1 = std::vector<Param,_std::allocator<Param>_>::begin
                     ((vector<Param,_std::allocator<Param>_> *)local_1b8);
  p = (Param *)std::vector<Param,_std::allocator<Param>_>::end
                         ((vector<Param,_std::allocator<Param>_> *)local_1b8);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Param_*,_std::vector<Param,_std::allocator<Param>_>_>
                                     *)&p), bVar1) {
    type_name.field_2._8_8_ =
         __gnu_cxx::__normal_iterator<Param_*,_std::vector<Param,_std::allocator<Param>_>_>::
         operator*(&__end1);
    if ((((reference)type_name.field_2._8_8_)->VSEnabled & 1U) != 0) {
      std::__cxx11::string::string(local_208);
      switch(*(undefined4 *)(type_name.field_2._8_8_ + 8)) {
      case 0:
        std::__cxx11::string::operator=(local_208,"clip");
        break;
      case 1:
        std::__cxx11::string::operator=(local_208,"int");
        break;
      case 2:
        std::__cxx11::string::operator=(local_208,"float");
        break;
      case 3:
        std::__cxx11::string::operator=(local_208,"int");
        break;
      case 4:
        std::__cxx11::string::operator=(local_208,"data");
      }
      poVar2 = std::operator<<(local_190,*(char **)type_name.field_2._8_8_);
      poVar2 = std::operator<<(poVar2,':');
      std::operator<<(poVar2,local_208);
      if ((*(byte *)(type_name.field_2._8_8_ + 0xc) & 1) != 0) {
        std::operator<<(local_190,"[]");
      }
      if ((*(byte *)(type_name.field_2._8_8_ + 0xf) & 1) != 0) {
        std::operator<<(local_190,":opt");
      }
      std::operator<<(local_190,';');
      std::__cxx11::string::~string(local_208);
    }
    __gnu_cxx::__normal_iterator<Param_*,_std::vector<Param,_std::allocator<Param>_>_>::operator++
              (&__end1);
  }
  std::__cxx11::stringstream::str();
  std::vector<Param,_std::allocator<Param>_>::~vector
            ((vector<Param,_std::allocator<Param>_> *)local_1b8);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)
             &params.super__Vector_base<Param,_std::allocator<Param>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

virtual const std::string VSParams() const
  {
    std::stringstream ss;
    auto params = this->Params();
    for (auto &&p : params)
    {
      if (!p.VSEnabled) continue;
      std::string type_name;
      switch(p.Type) {
        case Clip: type_name = "clip"; break;
        case Integer: type_name = "int"; break;
        case Float: type_name = "float"; break;
        case Boolean: type_name = "int"; break;
        case String: type_name = "data"; break;
      }
      ss << p.Name << ':' << type_name;
      if (p.IsArray)
        ss << "[]";
      if (p.IsOptional)
        ss << ":opt";
      ss << ';';
    }
    return ss.str();
  }